

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHPublicKey.cpp
# Opt level: O0

bool __thiscall DHPublicKey::deserialise(DHPublicKey *this,ByteString *serialised)

{
  size_t sVar1;
  long *in_RDI;
  ByteString dY;
  ByteString dG;
  ByteString dP;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined1 local_a0 [56];
  undefined1 local_68 [40];
  undefined1 local_40 [63];
  byte local_1;
  
  ByteString::chainDeserialise
            ((ByteString *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  ByteString::chainDeserialise
            ((ByteString *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  ByteString::chainDeserialise
            ((ByteString *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  sVar1 = ByteString::size((ByteString *)0x1a5fbe);
  if (sVar1 != 0) {
    sVar1 = ByteString::size((ByteString *)0x1a5fda);
    if (sVar1 != 0) {
      sVar1 = ByteString::size((ByteString *)0x1a5ff6);
      if (sVar1 != 0) {
        (**(code **)(*in_RDI + 0x30))(in_RDI,local_40);
        (**(code **)(*in_RDI + 0x38))(in_RDI,local_68);
        (**(code **)(*in_RDI + 0x40))(in_RDI,local_a0);
        local_1 = 1;
        goto LAB_001a60b0;
      }
    }
  }
  local_1 = 0;
LAB_001a60b0:
  ByteString::~ByteString((ByteString *)0x1a60ba);
  ByteString::~ByteString((ByteString *)0x1a60c4);
  ByteString::~ByteString((ByteString *)0x1a60d1);
  return (bool)(local_1 & 1);
}

Assistant:

bool DHPublicKey::deserialise(ByteString& serialised)
{
	ByteString dP = ByteString::chainDeserialise(serialised);
	ByteString dG = ByteString::chainDeserialise(serialised);
	ByteString dY = ByteString::chainDeserialise(serialised);

	if ((dP.size() == 0) ||
	    (dG.size() == 0) ||
	    (dY.size() == 0))
	{
		return false;
	}

	setP(dP);
	setG(dG);
	setY(dY);

	return true;
}